

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

CommandLineFlag * __thiscall
google::anon_unknown_1::FlagRegistry::FindFlagLocked(FlagRegistry *this,char *name)

{
  bool bVar1;
  pointer ppVar2;
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_char_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>
  local_38;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_char_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>
  local_28;
  FlagConstIterator i;
  char *name_local;
  FlagRegistry *this_local;
  
  i._M_node = (_Base_ptr)name;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<const_char_*,_google::(anonymous_namespace)::CommandLineFlag_*,_google::(anonymous_namespace)::StringCmp,_std::allocator<std::pair<const_char_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>_>
       ::find(&this->flags_,(key_type *)&i);
  std::
  _Rb_tree_const_iterator<std::pair<const_char_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>
  ::_Rb_tree_const_iterator(&local_28,&local_30);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<const_char_*,_google::(anonymous_namespace)::CommandLineFlag_*,_google::(anonymous_namespace)::StringCmp,_std::allocator<std::pair<const_char_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>_>
       ::end(&this->flags_);
  std::
  _Rb_tree_const_iterator<std::pair<const_char_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>
  ::_Rb_tree_const_iterator(&local_38,&local_40);
  bVar1 = std::operator==(&local_28,&local_38);
  if (bVar1) {
    this_local = (FlagRegistry *)0x0;
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_char_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>
             ::operator->(&local_28);
    this_local = (FlagRegistry *)ppVar2->second;
  }
  return (CommandLineFlag *)this_local;
}

Assistant:

CommandLineFlag* FlagRegistry::FindFlagLocked(const char* name) {
  FlagConstIterator i = flags_.find(name);
  if (i == flags_.end()) {
    return NULL;
  } else {
    return i->second;
  }
}